

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  Colour colourGuard;
  undefined8 uStack_28;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001d3e50 = 0x2d2d2d2d2d2d2d;
    uRam00000000001d3e57._0_1_ = '-';
    uRam00000000001d3e57._1_1_ = '-';
    uRam00000000001d3e57._2_1_ = '-';
    uRam00000000001d3e57._3_1_ = '-';
    uRam00000000001d3e57._4_1_ = '-';
    uRam00000000001d3e57._5_1_ = '-';
    uRam00000000001d3e57._6_1_ = '-';
    uRam00000000001d3e57._7_1_ = '-';
    DAT_001d3e40 = '-';
    DAT_001d3e40_1._0_1_ = '-';
    DAT_001d3e40_1._1_1_ = '-';
    DAT_001d3e40_1._2_1_ = '-';
    DAT_001d3e40_1._3_1_ = '-';
    DAT_001d3e40_1._4_1_ = '-';
    DAT_001d3e40_1._5_1_ = '-';
    DAT_001d3e40_1._6_1_ = '-';
    uRam00000000001d3e48 = 0x2d2d2d2d2d2d2d;
    DAT_001d3e4f = 0x2d;
    DAT_001d3e30 = '-';
    DAT_001d3e30_1._0_1_ = '-';
    DAT_001d3e30_1._1_1_ = '-';
    DAT_001d3e30_1._2_1_ = '-';
    DAT_001d3e30_1._3_1_ = '-';
    DAT_001d3e30_1._4_1_ = '-';
    DAT_001d3e30_1._5_1_ = '-';
    DAT_001d3e30_1._6_1_ = '-';
    uRam00000000001d3e38._0_1_ = '-';
    uRam00000000001d3e38._1_1_ = '-';
    uRam00000000001d3e38._2_1_ = '-';
    uRam00000000001d3e38._3_1_ = '-';
    uRam00000000001d3e38._4_1_ = '-';
    uRam00000000001d3e38._5_1_ = '-';
    uRam00000000001d3e38._6_1_ = '-';
    uRam00000000001d3e38._7_1_ = '-';
    DAT_001d3e20 = '-';
    DAT_001d3e20_1._0_1_ = '-';
    DAT_001d3e20_1._1_1_ = '-';
    DAT_001d3e20_1._2_1_ = '-';
    DAT_001d3e20_1._3_1_ = '-';
    DAT_001d3e20_1._4_1_ = '-';
    DAT_001d3e20_1._5_1_ = '-';
    DAT_001d3e20_1._6_1_ = '-';
    uRam00000000001d3e28._0_1_ = '-';
    uRam00000000001d3e28._1_1_ = '-';
    uRam00000000001d3e28._2_1_ = '-';
    uRam00000000001d3e28._3_1_ = '-';
    uRam00000000001d3e28._4_1_ = '-';
    uRam00000000001d3e28._5_1_ = '-';
    uRam00000000001d3e28._6_1_ = '-';
    uRam00000000001d3e28._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001d3e18._0_1_ = '-';
    uRam00000000001d3e18._1_1_ = '-';
    uRam00000000001d3e18._2_1_ = '-';
    uRam00000000001d3e18._3_1_ = '-';
    uRam00000000001d3e18._4_1_ = '-';
    uRam00000000001d3e18._5_1_ = '-';
    uRam00000000001d3e18._6_1_ = '-';
    uRam00000000001d3e18._7_1_ = '-';
    DAT_001d3e5f = 0;
  }
  uStack_28 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  Colour::Colour((Colour *)((long)&uStack_28 + 6),Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour((Colour *)((long)&uStack_28 + 6));
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}